

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.h
# Opt level: O0

void __thiscall FIX::MemoryStore::MemoryStore(MemoryStore *this)

{
  MemoryStore *this_local;
  
  MessageStore::MessageStore(&this->super_MessageStore);
  (this->super_MessageStore)._vptr_MessageStore = (_func_int **)&PTR__MemoryStore_0030c5d0;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->m_messages);
  this->m_nextSenderMsgSeqNum = 1;
  this->m_nextTargetMsgSeqNum = 1;
  UtcTimeStamp::UtcTimeStamp(&this->m_creationTime);
  return;
}

Assistant:

MemoryStore() : m_nextSenderMsgSeqNum( 1 ), m_nextTargetMsgSeqNum( 1 ) {}